

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall Parser::parseExpression(Parser *this)

{
  FILE *pFVar1;
  FILE *__stream;
  bool bVar2;
  __type_conflict _Var3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  Operate *o;
  pointer ppVar7;
  char *pcVar8;
  char *pcVar9;
  Expression *this_00;
  byte local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  byte local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  key_type local_1a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string p2Type;
  PrimaryExpression *p2;
  Operate *o1;
  key_type local_d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string p1Type;
  PrimaryExpression *p1;
  Parser *this_local;
  
  p1Type.field_2._8_8_ = parsePrimaryExpression(this);
  (*(((PrimaryExpression *)p1Type.field_2._8_8_)->super_AST)._vptr_AST[3])(local_38);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  pFVar1 = _stderr;
  if (sVar4 == 0) {
    (*(code *)**(undefined8 **)p1Type.field_2._8_8_)(&local_58);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_58);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    fprintf(pFVar1,"\x1b[31m\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n\x1b[0m",
            pcVar5,pcVar6);
    std::__cxx11::string::~string((string *)&local_58);
    exit(1);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"STRING");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"CHAR"), bVar2)) {
    (*(code *)**(undefined8 **)p1Type.field_2._8_8_)(&local_88);
    bVar2 = checkVarExists(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar2) {
      (*(code *)**(undefined8 **)p1Type.field_2._8_8_)(&local_d0);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
           ::find(&this->var_table,&local_d0);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>
               ::operator->(&local_b0);
      (**(((ppVar7->second).type)->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  Scanner::toUpper((string *)&o1,(string *)local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o1);
  std::__cxx11::string::~string((string *)&o1);
  o = parseOperator(this);
  p2Type.field_2._8_8_ = parsePrimaryExpression(this);
  (*(((PrimaryExpression *)p2Type.field_2._8_8_)->super_AST)._vptr_AST[3])(local_120);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
  ;
  pFVar1 = _stderr;
  if (sVar4 == 0) {
    (*(code *)**(undefined8 **)p2Type.field_2._8_8_)(&local_140);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_140);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_120);
    fprintf(pFVar1,"\x1b[31m\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n\x1b[0m",
            pcVar5,pcVar6);
    std::__cxx11::string::~string((string *)&local_140);
    exit(1);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120,"STRING");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_120,"CHAR"), bVar2)) {
    (*(code *)**(undefined8 **)p2Type.field_2._8_8_)(&local_160);
    bVar2 = checkVarExists(this,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    if (bVar2) {
      (*(code *)**(undefined8 **)p2Type.field_2._8_8_)(&local_1a8);
      local_188._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
           ::find(&this->var_table,&local_1a8);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>
               ::operator->(&local_188);
      (**(((ppVar7->second).type)->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_180)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
  }
  Scanner::toUpper(&local_1c8,(string *)local_120);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
             &local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  local_1e9 = 0;
  local_301 = 0;
  if (_Var3) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"STRING");
    if (!bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"CHAR");
      local_301 = 0;
      if (!bVar2) goto LAB_0013827e;
    }
    (**(o->super_Terminal).super_AST._vptr_AST)(&local_1e8);
    local_1e9 = 1;
    bVar2 = std::operator==(&local_1e8,"+");
    local_301 = bVar2 ^ 0xff;
  }
LAB_0013827e:
  if ((local_1e9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  pFVar1 = _stderr;
  if ((local_301 & 1) != 0) {
    (**(o->super_Terminal).super_AST._vptr_AST)(&local_210);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_210);
    (*(code *)**(undefined8 **)p1Type.field_2._8_8_)(&local_230);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_230);
    (*(code *)**(undefined8 **)p2Type.field_2._8_8_)(&local_250);
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_250);
    fprintf(pFVar1,"\x1b[31m\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n\x1b[0m"
            ,pcVar5,pcVar6,pcVar8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    exit(1);
  }
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_120);
  __stream = _stderr;
  pFVar1 = _stdout;
  if (((_Var3 ^ 0xffU) & 1) != 0) {
    (*(code *)**(undefined8 **)p1Type.field_2._8_8_)(&local_270);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_270);
    pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    (*(code *)**(undefined8 **)p2Type.field_2._8_8_)(&local_290);
    pcVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_290);
    pcVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_120);
    fprintf(__stream,
            "\x1b[31m\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n\x1b[0m"
            ,pcVar5,pcVar6,pcVar8,pcVar9);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    exit(1);
  }
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38)
  ;
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
                     );
  fprintf(pFVar1,
          "\x1b[32m\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n\x1b[0m"
          ,pcVar5,pcVar6);
  this_00 = (Expression *)operator_new(0x20);
  Expression::Expression
            (this_00,(PrimaryExpression *)p1Type.field_2._8_8_,
             (PrimaryExpression *)p2Type.field_2._8_8_,o);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_38);
  return this_00;
}

Assistant:

Expression *Parser::parseExpression() {
    // parse primary expression
    PrimaryExpression *p1 = parsePrimaryExpression();
    std::string p1Type = p1->getType();
    if (p1Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p1Type == "STRING" || p1Type == "CHAR") {
        if (checkVarExists(p1->describe())) {
            p1Type = var_table.find(p1->describe())->second.type->describe();
        }
    }
    p1Type = Scanner::toUpper(p1Type);

    // parse operator
    Operate *o1 = parseOperator();

    // parse primary expression
    PrimaryExpression *p2 = parsePrimaryExpression();
    std::string p2Type = p2->getType();
    if (p2Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p2->describe().data(), p2Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p2Type == "STRING" || p2Type == "CHAR") {
        if (checkVarExists(p2->describe())) {
            p2Type = var_table.find(p2->describe())->second.type->describe();
        }
    }
    p2Type = Scanner::toUpper(p2Type);

    // Check + is used with strings or chars
    if (p2Type == p1Type && (p1Type == "STRING" || p1Type == "CHAR") && o1->describe() != "+") {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n" ANSI_COLOR_RESET,
                o1->describe().data(), p1->describe().data(), p2->describe().data());
        exit(1);
    }

    // Check incompatible types
    if (p1Type != p2Type) {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data(), p2->describe().data(), p2Type.data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout,
                ANSI_COLOR_GREEN "\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1Type.data(), p2Type.data());
    }

    // Build Expression
    return new Expression(p1, p2, o1);
}